

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O2

int ply_add_comment(p_ply ply,char *comment)

{
  size_t sVar1;
  char *__dest;
  
  if ((comment != (char *)0x0) && (sVar1 = strlen(comment), sVar1 < 0x400)) {
    __dest = (char *)ply_grow_array(ply,&ply->comment,&ply->ncomments,0x400);
    if (__dest != (char *)0x0) {
      strcpy(__dest,comment);
      return 1;
    }
    return 0;
  }
  ply_ferror(ply,"Invalid arguments");
  return 0;
}

Assistant:

int ply_add_comment(p_ply ply, const char *comment) {
    char *new_comment = NULL;
    assert(ply && comment && strlen(comment) < LINESIZE);
    if (!comment || strlen(comment) >= LINESIZE) {
        ply_ferror(ply, "Invalid arguments");
        return 0;
    }
    new_comment = (char *) ply_grow_array(ply, (void **) &ply->comment,
            &ply->ncomments, LINESIZE);
    if (!new_comment) return 0;
    strcpy(new_comment, comment);
    return 1;
}